

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::FreeHandle(CSimpleHandleManager *this,CPalThread *pThread,HANDLE h)

{
  CRITICAL_SECTION *pCriticalSection;
  IPalObject *pIVar1;
  bool bVar2;
  HANDLE_TABLE_ENTRY *pHVar3;
  HANDLE_INDEX HVar4;
  
  pCriticalSection = &this->m_csLock;
  InternalEnterCriticalSection(pThread,pCriticalSection);
  bVar2 = ValidateHandle(this,h);
  if (bVar2) {
    if ((4 < (long)h - 0xffffff01U) || ((0x15UL >> ((long)h - 0xffffff01U & 0x3f) & 1) == 0)) {
      HVar4 = ((ulong)h >> 2) - 1;
      pHVar3 = this->m_rghteHandleTable;
      pIVar1 = pHVar3[HVar4].u.pObject;
      pHVar3[HVar4].fEntryAllocated = false;
      if (this->m_hiFreeListEnd == 0xffffffffffffffff) {
        this->m_hiFreeListStart = HVar4;
      }
      else {
        pHVar3[this->m_hiFreeListEnd].u.hiNextIndex = HVar4;
        pHVar3 = this->m_rghteHandleTable;
      }
      pHVar3[HVar4].u.hiNextIndex = 0xffffffffffffffff;
      this->m_hiFreeListEnd = HVar4;
      InternalLeaveCriticalSection(pThread,pCriticalSection);
      if (pIVar1 == (IPalObject *)0x0) {
        return 0;
      }
      (*pIVar1->_vptr_IPalObject[8])(pIVar1,pThread);
      return 0;
    }
    fprintf(_stderr,"] %s %s:%d","FreeHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handlemgr.cpp"
            ,0xe3);
    fprintf(_stderr,"Trying to free Special Handle %p.\n",h);
  }
  else if (PAL_InitializeChakraCoreCalled == false) {
    abort();
  }
  InternalLeaveCriticalSection(pThread,pCriticalSection);
  return 6;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::FreeHandle(
    CPalThread *pThread,
    HANDLE h
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj = NULL;
    HANDLE_INDEX hi = HandleToHandleIndex(h);

    Lock(pThread);

    if (!ValidateHandle(h))
    {
        ERROR("Trying to free invalid handle %p.\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto FreeHandleExit;
    }

    if (HandleIsSpecial(h))
    {
        ASSERT("Trying to free Special Handle %p.\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto FreeHandleExit;
    }

    pobj = m_rghteHandleTable[hi].u.pObject;
    m_rghteHandleTable[hi].fEntryAllocated = FALSE;

    /* add handle to the free pool */
    if(m_hiFreeListEnd != c_hiInvalid)
    {
        m_rghteHandleTable[m_hiFreeListEnd].u.hiNextIndex = hi;
    }
    else
    {
        m_hiFreeListStart = hi;
    }
    
    m_rghteHandleTable[hi].u.hiNextIndex = c_hiInvalid;
    m_hiFreeListEnd = hi;

FreeHandleExit:    

    Unlock(pThread);

    if (NULL != pobj)
    {
        pobj->ReleaseReference(pThread);
    }

    return palError;
}